

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O0

void get_16n_coeff_contexts_hor
               (uint8_t *levels,int width,int height,ptrdiff_t *offsets,int8_t *coeff_contexts)

{
  uint8_t *puVar1;
  ptrdiff_t *in_RCX;
  int in_EDX;
  int in_ESI;
  uint8_t *in_RDI;
  undefined8 *in_R8;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  int h;
  int col;
  __m128i level [5];
  __m128i count;
  __m128i pos_to_offset [3];
  int stride;
  int local_170;
  int local_16c;
  longlong local_168 [10];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  int local_d4;
  undefined8 *local_d0;
  ptrdiff_t *local_c8;
  int local_c0;
  uint8_t *local_b8;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined8 local_a8;
  undefined8 uStack_a0;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  char cStack_94;
  char cStack_93;
  char cStack_92;
  char cStack_91;
  char cStack_90;
  char cStack_8f;
  char cStack_8e;
  char cStack_8d;
  char cStack_8c;
  char cStack_8b;
  char cStack_8a;
  char cStack_89;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58;
  undefined1 local_57;
  undefined1 local_56;
  undefined1 local_55;
  undefined1 local_54;
  undefined1 local_53;
  undefined1 local_52;
  undefined1 local_51;
  undefined1 local_50;
  undefined1 local_4f;
  undefined1 local_4e;
  undefined1 local_4d;
  undefined1 local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  undefined1 local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined1 local_10;
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d;
  undefined1 local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  undefined1 local_8;
  undefined1 local_7;
  undefined1 local_6;
  undefined1 local_5;
  undefined1 local_4;
  undefined1 local_3;
  undefined1 local_2;
  undefined1 local_1;
  
  local_d4 = in_EDX + 4;
  local_a9 = 0x1a;
  local_49 = 0x1a;
  local_4a = 0x1a;
  local_4b = 0x1a;
  local_4c = 0x1a;
  local_4d = 0x1a;
  local_4e = 0x1a;
  local_4f = 0x1a;
  local_50 = 0x1a;
  local_51 = 0x1a;
  local_52 = 0x1a;
  local_53 = 0x1a;
  local_54 = 0x1a;
  local_55 = 0x1a;
  local_56 = 0x1a;
  local_57 = 0x1a;
  local_58 = 0x1a;
  local_108 = 0x1a1a1a1a1a1a1a1a;
  uStack_100 = 0x1a1a1a1a1a1a1a1a;
  local_aa = 0x1f;
  local_29 = 0x1f;
  local_2a = 0x1f;
  local_2b = 0x1f;
  local_2c = 0x1f;
  local_2d = 0x1f;
  local_2e = 0x1f;
  local_2f = 0x1f;
  local_30 = 0x1f;
  local_31 = 0x1f;
  local_32 = 0x1f;
  local_33 = 0x1f;
  local_34 = 0x1f;
  local_35 = 0x1f;
  local_36 = 0x1f;
  local_37 = 0x1f;
  local_38 = 0x1f;
  local_f8 = 0x1f1f1f1f1f1f1f1f;
  uStack_f0 = 0x1f1f1f1f1f1f1f1f;
  local_ab = 0x24;
  local_1 = 0x24;
  local_2 = 0x24;
  local_3 = 0x24;
  local_4 = 0x24;
  local_5 = 0x24;
  local_6 = 0x24;
  local_7 = 0x24;
  local_8 = 0x24;
  local_9 = 0x24;
  local_a = 0x24;
  local_b = 0x24;
  local_c = 0x24;
  local_d = 0x24;
  local_e = 0x24;
  local_f = 0x24;
  local_10 = 0x24;
  local_e8 = 0x2424242424242424;
  uStack_e0 = 0x2424242424242424;
  local_16c = in_ESI;
  local_d0 = in_R8;
  local_c8 = in_RCX;
  local_c0 = in_EDX;
  local_b8 = in_RDI;
  local_68 = local_108;
  uStack_60 = uStack_100;
  local_48 = local_f8;
  uStack_40 = uStack_f0;
  local_28 = local_e8;
  uStack_20 = uStack_e0;
  do {
    local_170 = local_c0;
    puVar1 = local_b8;
    do {
      local_b8 = puVar1;
      load_levels_16x1x5_sse2(local_b8,local_d4,local_c8,(__m128i *)local_168);
      get_coeff_contexts_kernel_sse2((__m128i *)local_168);
      local_98 = (char)extraout_XMM0_Qa;
      cStack_97 = (char)((ulong)extraout_XMM0_Qa >> 8);
      cStack_96 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
      cStack_95 = (char)((ulong)extraout_XMM0_Qa >> 0x18);
      cStack_94 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
      cStack_93 = (char)((ulong)extraout_XMM0_Qa >> 0x28);
      cStack_92 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
      cStack_91 = (char)((ulong)extraout_XMM0_Qa >> 0x38);
      cStack_90 = (char)extraout_XMM0_Qb;
      cStack_8f = (char)((ulong)extraout_XMM0_Qb >> 8);
      cStack_8e = (char)((ulong)extraout_XMM0_Qb >> 0x10);
      cStack_8d = (char)((ulong)extraout_XMM0_Qb >> 0x18);
      cStack_8c = (char)((ulong)extraout_XMM0_Qb >> 0x20);
      cStack_8b = (char)((ulong)extraout_XMM0_Qb >> 0x28);
      cStack_8a = (char)((ulong)extraout_XMM0_Qb >> 0x30);
      cStack_89 = (char)((ulong)extraout_XMM0_Qb >> 0x38);
      local_a8._0_1_ = (char)local_108;
      local_a8._1_1_ = (char)((ulong)local_108 >> 8);
      local_a8._2_1_ = (char)((ulong)local_108 >> 0x10);
      local_a8._3_1_ = (char)((ulong)local_108 >> 0x18);
      local_a8._4_1_ = (char)((ulong)local_108 >> 0x20);
      local_a8._5_1_ = (char)((ulong)local_108 >> 0x28);
      local_a8._6_1_ = (char)((ulong)local_108 >> 0x30);
      local_a8._7_1_ = (char)((ulong)local_108 >> 0x38);
      uStack_a0._0_1_ = (char)uStack_100;
      uStack_a0._1_1_ = (char)((ulong)uStack_100 >> 8);
      uStack_a0._2_1_ = (char)((ulong)uStack_100 >> 0x10);
      uStack_a0._3_1_ = (char)((ulong)uStack_100 >> 0x18);
      uStack_a0._4_1_ = (char)((ulong)uStack_100 >> 0x20);
      uStack_a0._5_1_ = (char)((ulong)uStack_100 >> 0x28);
      uStack_a0._6_1_ = (char)((ulong)uStack_100 >> 0x30);
      uStack_a0._7_1_ = (char)((ulong)uStack_100 >> 0x38);
      local_118 = CONCAT17(cStack_91 + local_a8._7_1_,
                           CONCAT16(cStack_92 + local_a8._6_1_,
                                    CONCAT15(cStack_93 + local_a8._5_1_,
                                             CONCAT14(cStack_94 + local_a8._4_1_,
                                                      CONCAT13(cStack_95 + local_a8._3_1_,
                                                               CONCAT12(cStack_96 + local_a8._2_1_,
                                                                        CONCAT11(cStack_97 +
                                                                                 local_a8._1_1_,
                                                                                 local_98 +
                                                                                 (char)local_a8)))))
                                   ));
      uStack_110 = CONCAT17(cStack_89 + uStack_a0._7_1_,
                            CONCAT16(cStack_8a + uStack_a0._6_1_,
                                     CONCAT15(cStack_8b + uStack_a0._5_1_,
                                              CONCAT14(cStack_8c + uStack_a0._4_1_,
                                                       CONCAT13(cStack_8d + uStack_a0._3_1_,
                                                                CONCAT12(cStack_8e + uStack_a0._2_1_
                                                                         ,CONCAT11(cStack_8f +
                                                                                   uStack_a0._1_1_,
                                                                                   cStack_90 +
                                                                                   (char)uStack_a0))
                                                               )))));
      local_70 = local_d0;
      local_88 = local_118;
      uStack_80 = uStack_110;
      *local_d0 = local_118;
      local_d0[1] = uStack_110;
      local_d0 = local_d0 + 2;
      local_170 = local_170 + -0x10;
      puVar1 = local_b8 + 0x10;
      local_a8 = local_108;
      uStack_a0 = uStack_100;
    } while (local_170 != 0);
    local_108 = local_f8;
    uStack_100 = uStack_f0;
    local_f8 = local_e8;
    uStack_f0 = uStack_e0;
    local_b8 = local_b8 + 0x14;
    local_16c = local_16c + -1;
  } while (local_16c != 0);
  return;
}

Assistant:

static inline void get_16n_coeff_contexts_hor(const uint8_t *levels,
                                              const int width, const int height,
                                              const ptrdiff_t *const offsets,
                                              int8_t *coeff_contexts) {
  const int stride = height + TX_PAD_HOR;
  __m128i pos_to_offset[3];
  __m128i count;
  __m128i level[5];
  int col = width;

  assert(!(height % 16));

  pos_to_offset[0] = _mm_set1_epi8(SIG_COEF_CONTEXTS_2D + 0);
  pos_to_offset[1] = _mm_set1_epi8(SIG_COEF_CONTEXTS_2D + 5);
  pos_to_offset[2] = _mm_set1_epi8(SIG_COEF_CONTEXTS_2D + 10);

  do {
    int h = height;

    do {
      load_levels_16x1x5_sse2(levels, stride, offsets, level);
      count = get_coeff_contexts_kernel_sse2(level);
      count = _mm_add_epi8(count, pos_to_offset[0]);
      _mm_store_si128((__m128i *)coeff_contexts, count);
      levels += 16;
      coeff_contexts += 16;
      h -= 16;
    } while (h);

    pos_to_offset[0] = pos_to_offset[1];
    pos_to_offset[1] = pos_to_offset[2];
    levels += TX_PAD_HOR;
  } while (--col);
}